

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_global_t * wasm_global_new(wasm_store_t *store,wasm_globaltype_t *type,wasm_val_t *val)

{
  FILE *__stream;
  undefined8 uVar1;
  wasm_global_t *this;
  GlobalType *pGVar2;
  TypedValue *tv;
  undefined8 in_R9;
  Value value_00;
  undefined1 local_88 [48];
  string local_58;
  undefined1 local_38 [8];
  TypedValue value;
  wasm_val_t *val_local;
  wasm_globaltype_t *type_local;
  wasm_store_t *store_local;
  
  value.value._8_8_ = val;
  if (store == (wasm_store_t *)0x0 || type == (wasm_globaltype_t *)0x0) {
    __assert_fail("store && type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x364,
                  "wasm_global_t *wasm_global_new(wasm_store_t *, const wasm_globaltype_t *, const wasm_val_t *)"
                 );
  }
  ToWabtValue((TypedValue *)local_38,val);
  __stream = _stderr;
  wabt::interp::TypedValueToString_abi_cxx11_((string *)(local_88 + 0x30),(interp *)local_38,tv);
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"CAPI: [%s] %s\n","wasm_global_new",uVar1);
  std::__cxx11::string::~string((string *)(local_88 + 0x30));
  this = (wasm_global_t *)operator_new(0x18);
  pGVar2 = wasm_externtype_t::As<wabt::interp::GlobalType>(&type->super_wasm_externtype_t);
  wabt::interp::GlobalType::GlobalType((GlobalType *)local_88,pGVar2);
  value_00._8_8_ = in_R9;
  value_00.i64_ = value.value.i64_;
  wabt::interp::Global::New
            ((Ptr *)(local_88 + 0x18),(Global *)store,(Store *)local_88,(GlobalType *)value._0_8_,
             value_00);
  wasm_global_t::wasm_global_t(this,(RefPtr<wabt::interp::Global> *)(local_88 + 0x18));
  wabt::interp::RefPtr<wabt::interp::Global>::~RefPtr
            ((RefPtr<wabt::interp::Global> *)(local_88 + 0x18));
  wabt::interp::GlobalType::~GlobalType((GlobalType *)local_88);
  return this;
}

Assistant:

own wasm_global_t* wasm_global_new(wasm_store_t* store,
                                   const wasm_globaltype_t* type,
                                   const wasm_val_t* val) {
  assert(store && type);
  TypedValue value = ToWabtValue(*val);
  TRACE("%s", TypedValueToString(value).c_str());
  return new wasm_global_t{
      Global::New(store->I, *type->As<GlobalType>(), value.value)};
}